

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,double,duckdb::BinaryLambdaWrapper,bool,duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,false,false>
               (string_t *ldata,string_t *rdata,double *result_data,idx_t count,ValidityMask *mask,
               anon_class_8_1_6971b95b fun)

{
  anon_class_8_1_6971b95b fun_00;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t left;
  string_t left_00;
  bool bVar1;
  undefined8 *puVar2;
  unsigned_long in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  undefined8 in_R9;
  double dVar3;
  string_t rentry_2;
  string_t lentry_2;
  idx_t i;
  string_t rentry_1;
  string_t lentry_1;
  idx_t start;
  string_t rentry;
  string_t lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t in_stack_fffffffffffffeb0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffeb8;
  ValidityMask *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  anon_class_8_1_6971b95b in_stack_fffffffffffffef0;
  idx_t in_stack_ffffffffffffff00;
  ulong idx;
  idx_t local_b0;
  unsigned_long local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  TemplatedValidityMask<unsigned_long> *local_30;
  unsigned_long local_28;
  void *local_20;
  void *local_18;
  void *local_10;
  undefined8 local_8;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_R9;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + in_RCX * 0x10),in_RDX,
             (void *)((long)in_RDX + in_RCX * 8),
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x4d);
  AssertRestrictFunction
            (local_18,(void *)((long)local_18 + local_28 * 0x10),local_20,
             (void *)((long)local_20 + local_28 * 8),
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_30);
  if (bVar1) {
    for (idx = 0; idx < local_28; idx = idx + 1) {
      puVar2 = (undefined8 *)((long)local_10 + idx * 0x10);
      fun_00.result = (Vector *)*puVar2;
      right_01.value.pointer.ptr = (char *)local_8;
      right_01.value._0_8_ = puVar2[1];
      dVar3 = BinaryLambdaWrapper::
              Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                        (fun_00,(string_t)
                                ((anon_union_16_2_67f50693_for_value *)((long)local_18 + idx * 0x10)
                                )->pointer,right_01,(ValidityMask *)fun_00.result,idx);
      *(double *)((long)local_20 + idx * 8) = dVar3;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0xea20d5);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      local_58 = MinValue<unsigned_long>(local_38 + 0x40,local_28);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar1) {
        for (; local_38 < local_58; local_38 = local_38 + 1) {
          puVar2 = (undefined8 *)((long)local_10 + local_38 * 0x10);
          local_90 = *puVar2;
          local_88 = puVar2[1];
          puVar2 = (undefined8 *)((long)local_18 + local_38 * 0x10);
          local_a0 = *puVar2;
          local_98 = puVar2[1];
          local_80 = local_8;
          left.value.pointer.ptr = (char *)in_stack_fffffffffffffee8;
          left.value._0_8_ = in_stack_fffffffffffffee0;
          right.value.pointer.ptr = (char *)in_stack_fffffffffffffed8;
          right.value._0_8_ = in_stack_fffffffffffffed0;
          local_78 = local_a0;
          local_70 = local_98;
          local_68 = local_90;
          local_60 = local_88;
          dVar3 = BinaryLambdaWrapper::
                  Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                            (in_stack_fffffffffffffef0,left,right,in_stack_fffffffffffffec8,
                             in_stack_ffffffffffffff00);
          *(double *)((long)local_20 + local_38 * 8) = dVar3;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar1) {
          local_38 = local_58;
        }
        else {
          local_a8 = local_38;
          for (; local_38 < local_58; local_38 = local_38 + 1) {
            local_b0 = local_38 - local_a8;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_b0);
            if (bVar1) {
              left_00.value.pointer.ptr = (char *)in_stack_fffffffffffffee8;
              left_00.value._0_8_ = in_stack_fffffffffffffee0;
              right_00.value.pointer.ptr = (char *)in_stack_fffffffffffffed8;
              right_00.value._0_8_ = in_stack_fffffffffffffed0;
              dVar3 = BinaryLambdaWrapper::
                      Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                (in_stack_fffffffffffffef0,left_00,right_00,
                                 in_stack_fffffffffffffec8,in_stack_ffffffffffffff00);
              *(double *)((long)local_20 + local_38 * 8) = dVar3;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}